

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

Optional<llbuild::buildsystem::BuildValue> * __thiscall
llbuild::buildsystem::BuildSystem::build
          (Optional<llbuild::buildsystem::BuildValue> *__return_storage_ptr__,BuildSystem *this,
          BuildKey *key)

{
  BuildSystemImpl *this_00;
  BuildKey local_40;
  BuildKey *local_20;
  BuildKey *key_local;
  BuildSystem *this_local;
  
  this_00 = (BuildSystemImpl *)this->impl;
  local_20 = key;
  key_local = (BuildKey *)this;
  this_local = (BuildSystem *)__return_storage_ptr__;
  BuildKey::BuildKey(&local_40,key);
  anon_unknown.dwarf_ecf33::BuildSystemImpl::build(__return_storage_ptr__,this_00,&local_40);
  BuildKey::~BuildKey(&local_40);
  return __return_storage_ptr__;
}

Assistant:

llvm::Optional<BuildValue> BuildSystem::build(BuildKey key) {
  return static_cast<BuildSystemImpl*>(impl)->build(key);
}